

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

PalEntry __thiscall APowerStrength::GetBlend(APowerStrength *this)

{
  anon_union_4_2_12391d7c_for_PalEntry_0 aVar1;
  int iVar2;
  
  iVar2 = *(int *)&(this->super_APowerup).super_AInventory.field_0x4dc >> 6;
  aVar1.d = 0;
  if (iVar2 < 0xc) {
    aVar1.d = (uint)(this->super_APowerup).BlendColor.field_0.field_0.g << 8 |
              (uint)(this->super_APowerup).BlendColor.field_0.field_0.r << 0x10 |
              ((uint)(this->super_APowerup).BlendColor.field_0.field_0.a * (0x13U - iVar2 >> 3) *
              0xff) / 9 << 0x18 | (uint)(this->super_APowerup).BlendColor.field_0.field_0.b;
  }
  return (anon_union_4_2_12391d7c_for_PalEntry_0)
         (anon_union_4_2_12391d7c_for_PalEntry_0)aVar1.field_0;
}

Assistant:

PalEntry APowerStrength::GetBlend ()
{
	// slowly fade the berserk out
	int cnt = 12 - (EffectTics >> 6);

	if (cnt > 0)
	{
		cnt = (cnt + 7) >> 3;
		return PalEntry (BlendColor.a*cnt*255/9,
			BlendColor.r, BlendColor.g, BlendColor.b);
	}
	return 0;
}